

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int bufs_alloc_chain(nghttp2_bufs *bufs)

{
  nghttp2_buf_chain *local_28;
  nghttp2_buf_chain *chain;
  nghttp2_bufs *pnStack_18;
  int rv;
  nghttp2_bufs *bufs_local;
  
  if (bufs->cur->next == (nghttp2_buf_chain *)0x0) {
    if (bufs->max_chunk == bufs->chunk_used) {
      bufs_local._4_4_ = -0x1f6;
    }
    else {
      pnStack_18 = bufs;
      bufs_local._4_4_ = buf_chain_new(&local_28,bufs->chunk_length,bufs->mem);
      if (bufs_local._4_4_ == 0) {
        pnStack_18->chunk_used = pnStack_18->chunk_used + 1;
        pnStack_18->cur->next = local_28;
        pnStack_18->cur = local_28;
        (pnStack_18->cur->buf).pos = (pnStack_18->cur->buf).pos + pnStack_18->offset;
        (pnStack_18->cur->buf).last = (pnStack_18->cur->buf).last + pnStack_18->offset;
        bufs_local._4_4_ = 0;
      }
    }
  }
  else {
    bufs->cur = bufs->cur->next;
    bufs_local._4_4_ = 0;
  }
  return bufs_local._4_4_;
}

Assistant:

static int bufs_alloc_chain(nghttp2_bufs *bufs) {
  int rv;
  nghttp2_buf_chain *chain;

  if (bufs->cur->next) {
    bufs->cur = bufs->cur->next;

    return 0;
  }

  if (bufs->max_chunk == bufs->chunk_used) {
    return NGHTTP2_ERR_BUFFER_ERROR;
  }

  rv = buf_chain_new(&chain, bufs->chunk_length, bufs->mem);
  if (rv != 0) {
    return rv;
  }

  DEBUGF("new buffer %zu bytes allocated for bufs %p, used %zu\n",
         bufs->chunk_length, bufs, bufs->chunk_used);

  ++bufs->chunk_used;

  bufs->cur->next = chain;
  bufs->cur = chain;

  nghttp2_buf_shift_right(&bufs->cur->buf, bufs->offset);

  return 0;
}